

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

void chaiscript::dispatch::detail::
     call_func<void(*)(std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&),void,std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,int,chaiscript::Boxed_Value_const&,0ul,1ul,2ul>
               (undefined8 param_1,undefined8 *param_2,long *param_3,Type_Conversions_State *param_4
               )

{
  code *pcVar1;
  int iVar2;
  list<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *plVar3;
  chaiscript acStack_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pcVar1 = (code *)*param_2;
  plVar3 = boxed_cast<std::__cxx11::list<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
                     ((Boxed_Value *)*param_3,param_4);
  iVar2 = boxed_cast<int>((Boxed_Value *)(*param_3 + 0x10),param_4);
  boxed_cast<chaiscript::Boxed_Value_const&>(acStack_38,(Boxed_Value *)(*param_3 + 0x20),param_4);
  (*pcVar1)(plVar3,iVar2,acStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }